

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O1

uint8_t * tcv_get_vendor_rom(tcv_t *tcv)

{
  int iVar1;
  uint8_t *puVar2;
  
  if ((tcv != (tcv_t *)0x0) && (tcv->created == true)) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    if (iVar1 == 0) {
      if (((tcv == (tcv_t *)0x0) || (tcv->created != true)) || (tcv->initialized != true)) {
        puVar2 = (uint8_t *)0x0;
      }
      else {
        puVar2 = (*tcv->fun->get_vendor_rom)(tcv);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
      return puVar2;
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

static bool tcv_is_valid(tcv_t *tcv)
{
	/* Check if parametes is valid/was created successfully by tcv_create */
	if (tcv && tcv->created)
		return true;

	return false;
}